

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v7::basic_format_specs<char>::basic_format_specs(basic_format_specs<char> *this)

{
  this->width = 0;
  this->precision = -1;
  this->type = '\0';
  this->field_0x9 = 0;
  (this->fill).data_[0] = ' ';
  (this->fill).data_[1] = '\0';
  (this->fill).data_[2] = '\0';
  (this->fill).data_[3] = '\0';
  (this->fill).size_ = '\x01';
  return;
}

Assistant:

constexpr basic_format_specs()
      : width(0),
        precision(-1),
        type(0),
        align(align::none),
        sign(sign::none),
        alt(false) {}